

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O3

PrimaryHeader *
lrit::getHeader<lrit::PrimaryHeader>(PrimaryHeader *__return_storage_ptr__,Buffer *b,int pos)

{
  ushort uVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  
  puVar3 = (b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = *(ushort *)(puVar3 + (pos + 1));
  __return_storage_ptr__->headerType = puVar3[pos];
  __return_storage_ptr__->headerLength = uVar1 << 8 | uVar1 >> 8;
  __return_storage_ptr__->fileType = puVar3[pos + 3];
  uVar2 = *(uint *)(puVar3 + (pos + 4));
  __return_storage_ptr__->totalHeaderLength =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar4 = *(ulong *)(puVar3 + (pos + 8));
  __return_storage_ptr__->dataLength =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  return __return_storage_ptr__;
}

Assistant:

PrimaryHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<PrimaryHeader>(b, pos);
  auto h = r.getHeader();
  r.read(&h.fileType);
  r.read(&h.totalHeaderLength);
  r.read(&h.dataLength);
  return h;
}